

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mzd_additional.c
# Opt level: O1

void mzd_addmul_v_uint64_30_128(mzd_local_t *c,mzd_local_t *v,mzd_local_t *A)

{
  ulong uVar1;
  uint i;
  int iVar2;
  uint j;
  long lVar3;
  
  uVar1 = v->w64[1] >> 0x22;
  iVar2 = 0xf;
  do {
    lVar3 = 0;
    do {
      c->w64[lVar3] =
           c->w64[lVar3] ^
           A->w64[lVar3 + 2] & (long)(uVar1 << 0x3e) >> 0x3f ^
           A->w64[lVar3] & -(ulong)((uint)uVar1 & 1);
      lVar3 = lVar3 + 1;
    } while (lVar3 == 1);
    uVar1 = uVar1 >> 2;
    A = A + 1;
    iVar2 = iVar2 + -1;
  } while (iVar2 != 0);
  return;
}

Assistant:

void mzd_addmul_v_uint64_30_128(mzd_local_t* c, mzd_local_t const* v, mzd_local_t const* A) {
  block_t* cblock       = BLOCK(c, 0);
  const block_t* Ablock = CONST_BLOCK(A, 0);

  word idx = CONST_BLOCK(v, 0)->w64[1] >> 34;
  for (unsigned int i = 15; i; --i, idx >>= 2, ++Ablock) {
    const word mask1 = -(idx & 1);
    const word mask2 = -((idx >> 1) & 1);
    for (unsigned int j = 0; j < 2; ++j) {
      cblock->w64[j] ^= (Ablock->w64[j] & mask1) ^ (Ablock->w64[j + 2] & mask2);
    }
  }
}